

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

WordType llvm::APInt::tcAddPart(WordType *dst,WordType src,uint parts)

{
  WordType *pWVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (parts == 0) {
    return 1;
  }
  uVar2 = *dst;
  *dst = *dst + src;
  if (!CARRY8(uVar2,src)) {
    return 0;
  }
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    if (parts == uVar3) break;
    pWVar1 = dst + uVar3;
    *pWVar1 = *pWVar1 + 1;
    uVar2 = uVar3 + 1;
  } while (*pWVar1 == 0);
  return (ulong)(parts <= uVar3);
}

Assistant:

APInt::WordType APInt::tcAddPart(WordType *dst, WordType src,
                                 unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    dst[i] += src;
    if (dst[i] >= src)
      return 0; // No need to carry so exit early.
    src = 1; // Carry one to next digit.
  }

  return 1;
}